

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O3

LispPTR rplacd(LispPTR x,LispPTR y)

{
  LispPTR *pLVar1;
  ulong uVar2;
  DLword *pDVar3;
  LispPTR LVar4;
  LispPTR ptr;
  uint uVar5;
  long lVar6;
  ConsCell *pCVar7;
  char *cp;
  uint uVar8;
  ulong uVar9;
  conspage *pcVar10;
  
  uVar2 = (ulong)x;
  if ((*(ushort *)((ulong)(MDStypetbl + (x >> 9)) ^ 2) & 0x7ff) != 5) {
    if (x == 0) {
      if (y == 0) {
        return x;
      }
      cp = "Attempt to RPLACD NIL";
    }
    else {
      cp = "ARG not List";
    }
    error(cp);
    return x;
  }
  if ((x & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
  }
  pDVar3 = MDStypetbl;
  lVar6 = CONCAT44(Lisp_world._4_4_,(int)Lisp_world);
  LVar4 = cdr(x);
  if ((-1 < *(short *)((ulong)(pDVar3 + (LVar4 >> 9)) ^ 2)) && (*GcDisabled_word != 0x4c)) {
    LVar4 = *Reclaim_cnt_word;
    ptr = cdr(x);
    if (LVar4 == 0) {
      rec_htfind(ptr,1);
    }
    else {
      htfind(ptr,1);
    }
  }
  if ((-1 < *(short *)((ulong)(y >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2)) &&
     (*GcDisabled_word != 0x4c)) {
    if (*Reclaim_cnt_word == 0) {
      rec_htfind(y,0);
    }
    else {
      htfind(y,0);
    }
  }
  uVar8 = *(uint *)(lVar6 + uVar2 * 2);
  uVar9 = (ulong)uVar8;
  if (uVar9 < 0x10000000) {
    if ((uVar8 & 1) == 0) {
      lVar6 = CONCAT44(Lisp_world._4_4_,(int)Lisp_world);
      uVar8 = uVar8 + (*(uint *)(lVar6 + uVar9 * 2) >> 0x1c) * 2;
    }
    else {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
      uVar8 = uVar8 + (*(uint *)(CONCAT44(Lisp_world._4_4_,(int)Lisp_world) + uVar9 * 2) >> 0x1c) *
                      2;
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar8);
      lVar6 = CONCAT44(Lisp_world._4_4_,(int)Lisp_world);
    }
  }
  else {
    if ((int)uVar8 < 0) {
      if (y == 0) {
        uVar8 = uVar8 & 0x8fffffff;
LAB_00113236:
        *(uint *)(lVar6 + uVar2 * 2) = uVar8;
        return x;
      }
      uVar5 = x & 0xfffff00;
      if (((x + 0xe < y) || (y < x || y - x == 0)) || (uVar5 != (y & 0xfffff00))) {
        if ((*(uint *)(CONCAT44(Lisp_world._4_4_,(int)Lisp_world) + 8 + (ulong)uVar5 * 2) <
             0x1000000) ||
           (pCVar7 = find_close_cell((conspage *)
                                     (CONCAT44(Lisp_world._4_4_,(int)Lisp_world) + (ulong)uVar5 * 2)
                                     ,x), pCVar7 == (ConsCell *)0x0)) {
          if (ListpDTD->dtd_nextpage != 0) {
            pcVar10 = (conspage *)
                      ((ulong)(ListpDTD->dtd_nextpage << 8) * 2 +
                      CONCAT44(Lisp_world._4_4_,(int)Lisp_world));
            do {
              pCVar7 = find_cdrpair_in_page(pcVar10,x,y);
              if (pCVar7 != (ConsCell *)0x0) goto LAB_001131f1;
              pLVar1 = &pcVar10->next_page;
              pcVar10 = (conspage *)
                        ((ulong)(*pLVar1 << 8) * 2 + CONCAT44(Lisp_world._4_4_,(int)Lisp_world));
            } while (*pLVar1 != 0);
          }
          pcVar10 = next_conspage();
          pCVar7 = find_cdrpair_in_page(pcVar10,x,y);
LAB_001131f1:
          *pCVar7 = (ConsCell)
                    ((uint)*pCVar7 & 0xf0000000 | *(uint *)(lVar6 + uVar2 * 2) & 0xfffffff);
          if (((ulong)pCVar7 & 1) != 0) {
            printf("Misaligned pointer in LAddrFromNative %p\n",pCVar7);
          }
          uVar8 = (uint)((int)pCVar7 - (int)Lisp_world) >> 1 & 0xfffffff;
          goto LAB_00113236;
        }
        *pCVar7 = (ConsCell)(y & 0xfffffff);
        if (((ulong)pCVar7 & 1) != 0) {
          printf("Misaligned pointer in LAddrFromNative %p\n",pCVar7);
        }
        uVar8 = *(uint *)(lVar6 + uVar2 * 2) & 0xfffffff |
                (((uint)((int)pCVar7 - (int)Lisp_world) >> 1) - x & 0xfffffffe) << 0x1b;
      }
      else {
        uVar8 = (uVar8 & 0xfffffff) + (y - x & 0xfffffffe) * 0x8000000 + 0x80000000;
      }
      *(uint *)(lVar6 + uVar2 * 2) = uVar8;
      return x;
    }
    uVar8 = (uVar8 >> 0x1b & 0xe) + x;
    if ((x & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar8);
    }
    lVar6 = CONCAT44(Lisp_world._4_4_,(int)Lisp_world);
  }
  *(LispPTR *)(lVar6 + (ulong)uVar8 * 2) = y & 0xfffffff;
  return x;
}

Assistant:

LispPTR rplacd(LispPTR x, LispPTR y)
{
  ConsCell *x_68k;
  ConsCell *temp68k;
  ConsCell *cdr_cell68k;
  LispPTR cdr_cell;
  LispPTR rp_page;
  DLword cdr_code;
  struct conspage *cons68k;

  if (Listp(x) == NIL) {
    if (x == NIL_PTR) {
      if (y != NIL_PTR)
        error("Attempt to RPLACD NIL");
      else
        return (NIL_PTR);
    } else
      error("ARG not List");
  }

  else {
    x_68k = (ConsCell *)NativeAligned4FromLAddr(x);

    GCLOOKUP(cdr(x), DELREF); /* set up reference count */
    GCLOOKUP(y, ADDREF);

    cdr_code = x_68k->cdr_code;

    if (cdr_code == CDR_INDIRECT) {
      /* cdr-indirect */

      rp_page = (LispPTR)x_68k->car_field;
      temp68k = (ConsCell *)NativeAligned4FromLAddr(rp_page);
#ifdef NEWCDRCODING
      cdr_cell = (rp_page) + (temp68k->cdr_code << 1);
#else
      cdr_cell = POINTER_PAGEBASE(rp_page) + (temp68k->cdr_code << 1);
#endif /* NEWCDRCODING */

      cdr_cell68k = (ConsCell *)NativeAligned4FromLAddr(cdr_cell);
      *(LispPTR *)cdr_cell68k = y & POINTERMASK; /* cdr_code is set to 0 */
    } else if (cdr_code <= CDR_MAXINDIRECT) {
/* cdr-differentpage */
#ifdef NEWCDRCODING
      cdr_cell = x + (cdr_code << 1);
#else
      cdr_cell = POINTER_PAGEBASE(x) + (cdr_code << 1);
#endif /* NEWCDRCODING */
      cdr_cell68k = (ConsCell *)NativeAligned4FromLAddr(cdr_cell);
      *(LispPTR *)cdr_cell68k = y & POINTERMASK; /* cdr_code is set to 0 */

    } else if (y == NIL_PTR)
      /* cdr-samepage & y is nil */
      x_68k->cdr_code = CDR_NIL;
#ifdef NEWCDRCODING
    else if (((rp_page = POINTER_PAGEBASE(x)) == POINTER_PAGEBASE(y)) && (y > x) && (y <= (x + 14)))
      /* cdr-samepage & x and y are on same page */
      x_68k->cdr_code = CDR_ONPAGE + ((y - x) >> 1);
#else
    else if ((rp_page = POINTER_PAGEBASE(x)) == POINTER_PAGEBASE(y))
      /* cdr-samepage & x and y are on same page */
      x_68k->cdr_code = CDR_ONPAGE + ((y & 0xff) >> 1);
#endif /* NEWCDRCODING */
    else {
      /* cdr-samepage & x and y are on different page */

      cons68k = (struct conspage *)(NativeAligned4FromLAddr(rp_page));
#ifdef NEWCDRCODING
      if ((cons68k->count > 0) && (cdr_cell68k = find_close_cell(cons68k, x))) {
        /* at least one free-cell on x's conspage */
        /* AND it's within CDR-code range of x. */

        *(LispPTR *)cdr_cell68k = y & POINTERMASK; /* cdr_code set to 0 */

        x_68k->cdr_code = (LAddrFromNative(cdr_cell68k) - x) >> 1;
      }
#else
      if (cons68k->count > 0) {
        /* at least one free-cell on x's conspage */
        cdr_cell68k = GetNewCell_68k(cons68k);
        cons68k->count--;
        cons68k->next_cell = ((freecons *)cdr_cell68k)->next_free;

        *(LispPTR *)cdr_cell68k = y & POINTERMASK; /* cdr_code set to 0 */

        x_68k->cdr_code = (LAddrFromNative(cdr_cell68k) - rp_page) >> 1;
      }
#endif /* NEWCDRCODING */
      else {
/* no more free-cell on x's conspage */
#ifdef NEWCDRCODING
        temp68k = (ConsCell *)find_cdrable_pair(x, y);
        temp68k->car_field = x_68k->car_field;
        x_68k->car_field = LAddrFromNative(temp68k);
        x_68k->cdr_code = CDR_INDIRECT;
#else
        cons68k = next_conspage();

        cdr_cell68k = GetNewCell_68k(cons68k);
        cons68k->next_cell = ((freecons *)cdr_cell68k)->next_free;
        temp68k = GetNewCell_68k(cons68k);
        cons68k->next_cell = ((freecons *)temp68k)->next_free;

        cons68k->count -= 2;

        *(LispPTR *)cdr_cell68k = y & POINTERMASK; /* cdr_code set to 0 */

        temp68k->car_field = x_68k->car_field;
        x_68k->car_field = LAddrFromNative(temp68k);

        temp68k->cdr_code = (LAddrFromNative(cdr_cell68k) & 0xff) >> 1;

        x_68k->cdr_code = CDR_INDIRECT;
#endif /* NEWCDRCODING */
      }
    }
  }